

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O1

ostream * fizplex::operator<<(ostream *os,Column *c)

{
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  ColType local_104 [5];
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  if (operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,fizplex::LP::Column_const&)::
                                 ctos_abi_cxx11_);
    if (iVar1 != 0) {
      local_104[4] = 0;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[6],_true>
                (&local_f0,local_104 + 4,(char (*) [6])0x19ec9a);
      local_104[3] = 1;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[8],_true>
                (&local_c8,local_104 + 3,(char (*) [8])0x19ecc2);
      local_104[2] = 2;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[11],_true>
                (&local_a0,local_104 + 2,(char (*) [11])0x19ecec);
      local_104[1] = 3;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[5],_true>
                (&local_78,local_104 + 1,(char (*) [5])0x19ed19);
      local_104[0] = UpperBound;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[11],_true>
                (&local_50,local_104,(char (*) [11])0x19ed40);
      std::
      _Hashtable<fizplex::ColType,std::pair<fizplex::ColType_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::ColType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::ColType>,std::hash<fizplex::ColType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<fizplex::ColType_const,std::__cxx11::string>const*>
                ((_Hashtable<fizplex::ColType,std::pair<fizplex::ColType_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::ColType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::ColType>,std::hash<fizplex::ColType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_,&local_f0
                 ,&stack0xffffffffffffffd8,0,&local_105,&local_106,&local_107);
      lVar5 = -200;
      paVar4 = &local_50.second.field_2;
      do {
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar4->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                          paVar4->_M_allocated_capacity + 1);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar4->_M_allocated_capacity + -5);
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0);
      __cxa_atexit(std::
                   unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_);
    }
  }
  pmVar2 = std::__detail::
           _Map_base<fizplex::ColType,_std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::ColType>,_std::hash<fizplex::ColType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<fizplex::ColType,_std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::ColType>,_std::hash<fizplex::ColType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_,
                        &c->type);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::ostream::_M_insert<double>(c->lower);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," <= x <= ",9);
  std::ostream::_M_insert<double>(c->upper);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const LP::Column &c) {
  static std::unordered_map<ColType, std::string> ctos = {
      {ColType::Fixed, "Fixed"},
      {ColType::Bounded, "Bounded"},
      {ColType::LowerBound, "LowerBound"},
      {ColType::Free, "Free"},
      {ColType::UpperBound, "UpperBound"}};
  os << ctos[c.type] << ": " << c.lower << " <= x <= " << c.upper;
  return os;
}